

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_str_init_default(nk_str *str)

{
  nk_allocator alloc;
  nk_handle local_20;
  code *local_18;
  code *local_10;
  
  local_20.ptr = (void *)0x0;
  local_18 = nk_malloc;
  local_10 = nk_mfree;
  nk_buffer_init(&str->buffer,(nk_allocator *)&local_20,0x20);
  str->len = 0;
  return;
}

Assistant:

NK_API void
nk_str_init_default(struct nk_str *str)
{
    struct nk_allocator alloc;
    alloc.userdata.ptr = 0;
    alloc.alloc = nk_malloc;
    alloc.free = nk_mfree;
    nk_buffer_init(&str->buffer, &alloc, 32);
    str->len = 0;
}